

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O2

void secp256k1_scalar_reduce_512(secp256k1_scalar *r,uint32_t *l)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  bool bVar39;
  uint uVar12;
  uint uVar27;
  
  uVar9 = l[8];
  uVar3 = (ulong)uVar9;
  uVar1 = l[9];
  uVar7 = (ulong)uVar1;
  uVar6 = (uint)(uVar3 * 0x2fc9bebf);
  uVar4 = (int)(uVar3 * 0x2fc9bebf >> 0x20) + l[1] + (uint)CARRY4(uVar6,*l);
  uVar17 = (uint)(uVar7 * 0x2fc9bebf);
  uVar22 = uVar17 + uVar4;
  uVar15 = l[10];
  uVar13 = (ulong)uVar15;
  uVar20 = (uint)(uVar3 * 0x402da173);
  uVar33 = uVar20 + uVar22;
  uVar22 = (int)(uVar3 * 0x402da173 >> 0x20) + (int)(uVar7 * 0x2fc9bebf >> 0x20) + l[2] +
           (uint)(uVar4 < l[1]) + (uint)CARRY4(uVar17,uVar4) + (uint)CARRY4(uVar20,uVar22);
  uVar4 = l[0xb];
  uVar14 = (ulong)uVar4;
  uVar20 = (uint)(uVar13 * 0x2fc9bebf);
  uVar17 = uVar20 + uVar22;
  uVar18 = (uint)(uVar7 * 0x402da173);
  uVar23 = uVar18 + uVar17;
  uVar19 = (uint)(uVar3 * 0x50b75fc4);
  uVar34 = uVar19 + uVar23;
  uVar22 = (uint)CARRY4(uVar18,uVar17) +
           (int)(uVar13 * 0x2fc9bebf >> 0x20) + l[3] +
           (int)(uVar3 * 0x50b75fc4 >> 0x20) + (int)(uVar7 * 0x402da173 >> 0x20) +
           (uint)(uVar22 < l[2]) + (uint)CARRY4(uVar20,uVar22) + (uint)CARRY4(uVar19,uVar23);
  uVar19 = (uint)(uVar14 * 0x2fc9bebf);
  uVar24 = uVar19 + uVar22;
  uVar18 = (uint)(uVar13 * 0x402da173);
  uVar23 = uVar18 + uVar24;
  uVar20 = (uint)(uVar7 * 0x50b75fc4);
  uVar17 = uVar20 + uVar23;
  uVar18 = (uint)CARRY4(uVar18,uVar24) +
           (int)(uVar7 * 0x50b75fc4 >> 0x20) + (int)(uVar13 * 0x402da173 >> 0x20) +
           (int)(uVar14 * 0x2fc9bebf >> 0x20) + (uint)(uVar22 < l[3]) + (uint)CARRY4(uVar19,uVar22)
           + (uint)CARRY4(uVar20,uVar23);
  uVar22 = l[0xc];
  uVar10 = (ulong)uVar22;
  uVar20 = (uint)(uVar3 * 0x45512319);
  uVar35 = uVar20 + uVar17;
  uVar17 = (uint)CARRY4(uVar20,uVar17);
  uVar24 = (uint)(uVar3 * 0x45512319 >> 0x20);
  uVar20 = uVar18 + uVar24;
  uVar23 = uVar20 + uVar17;
  uVar19 = uVar23 + l[4];
  uVar21 = (uint)(uVar10 * 0x2fc9bebf);
  uVar28 = uVar21 + uVar19;
  uVar25 = (uint)(uVar14 * 0x402da173);
  uVar32 = uVar25 + uVar28;
  uVar36 = (uint)(uVar13 * 0x50b75fc4);
  uVar28 = (uint)CARRY4(uVar25,uVar28) +
           (uint)CARRY4(uVar23,l[4]) +
           (int)(uVar10 * 0x2fc9bebf >> 0x20) +
           (int)(uVar13 * 0x50b75fc4 >> 0x20) + (int)(uVar14 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar18,uVar24) || CARRY4(uVar20,uVar17)) + (uint)CARRY4(uVar21,uVar19) +
           (uint)CARRY4(uVar36,uVar32);
  lVar8 = uVar7 * 0x45512319 + (ulong)(uVar36 + uVar32);
  uVar20 = (uint)lVar8;
  uVar23 = (uint)((ulong)lVar8 >> 0x20);
  uVar17 = l[0xd];
  uVar3 = (ulong)uVar17;
  uVar21 = uVar20 + uVar9;
  uVar9 = (uint)CARRY4(uVar20,uVar9);
  uVar20 = uVar23 + uVar28;
  uVar19 = uVar20 + uVar9;
  uVar24 = uVar19 + l[5];
  uVar32 = (uint)(uVar3 * 0x2fc9bebf);
  uVar25 = uVar32 + uVar24;
  uVar29 = (uint)(uVar10 * 0x402da173);
  uVar36 = uVar29 + uVar25;
  uVar18 = (uint)(uVar14 * 0x50b75fc4);
  uVar24 = (uint)CARRY4(uVar29,uVar25) +
           (uint)CARRY4(uVar19,l[5]) +
           (int)(uVar3 * 0x2fc9bebf >> 0x20) +
           (int)(uVar14 * 0x50b75fc4 >> 0x20) + (int)(uVar10 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar23,uVar28) || CARRY4(uVar20,uVar9)) + (uint)CARRY4(uVar32,uVar24) +
           (uint)CARRY4(uVar18,uVar36);
  lVar8 = uVar13 * 0x45512319 + (ulong)(uVar18 + uVar36);
  uVar20 = (uint)lVar8;
  uVar18 = (uint)((ulong)lVar8 >> 0x20);
  uVar9 = l[0xe];
  uVar7 = (ulong)uVar9;
  uVar37 = uVar20 + uVar1;
  uVar1 = (uint)CARRY4(uVar20,uVar1);
  uVar20 = uVar18 + uVar24;
  uVar23 = uVar20 + uVar1;
  uVar19 = uVar23 + l[6];
  uVar25 = (uint)(uVar7 * 0x2fc9bebf);
  uVar32 = uVar25 + uVar19;
  uVar29 = (uint)(uVar3 * 0x402da173);
  uVar36 = uVar29 + uVar32;
  uVar28 = (uint)(uVar10 * 0x50b75fc4);
  uVar32 = (uint)CARRY4(uVar29,uVar32) +
           (uint)CARRY4(uVar23,l[6]) +
           (int)(uVar7 * 0x2fc9bebf >> 0x20) +
           (int)(uVar10 * 0x50b75fc4 >> 0x20) + (int)(uVar3 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar18,uVar24) || CARRY4(uVar20,uVar1)) + (uint)CARRY4(uVar25,uVar19) +
           (uint)CARRY4(uVar28,uVar36);
  lVar8 = uVar14 * 0x45512319 + (ulong)(uVar28 + uVar36);
  uVar20 = (uint)lVar8;
  uVar18 = (uint)((ulong)lVar8 >> 0x20);
  uVar1 = l[0xf];
  uVar13 = (ulong)uVar1;
  uVar38 = uVar20 + uVar15;
  uVar15 = (uint)CARRY4(uVar20,uVar15);
  uVar20 = uVar18 + uVar32;
  uVar23 = uVar20 + uVar15;
  uVar19 = uVar23 + l[7];
  uVar29 = (uint)(uVar13 * 0x2fc9bebf);
  uVar36 = uVar29 + uVar19;
  uVar24 = (uint)(uVar7 * 0x402da173);
  uVar28 = uVar24 + uVar36;
  uVar25 = (uint)(uVar3 * 0x50b75fc4);
  uVar20 = (uint)CARRY4(uVar24,uVar36) +
           (uint)CARRY4(uVar23,l[7]) +
           (int)(uVar13 * 0x2fc9bebf >> 0x20) +
           (int)(uVar3 * 0x50b75fc4 >> 0x20) + (int)(uVar7 * 0x402da173 >> 0x20) +
           (uint)(CARRY4(uVar18,uVar32) || CARRY4(uVar20,uVar15)) + (uint)CARRY4(uVar29,uVar19) +
           (uint)CARRY4(uVar25,uVar28);
  lVar8 = uVar10 * 0x45512319 + (ulong)(uVar25 + uVar28);
  uVar15 = (uint)lVar8;
  uVar29 = (uint)((ulong)lVar8 >> 0x20);
  uVar28 = (uint)(uVar13 * 0x50b75fc4);
  uVar24 = uVar15 + uVar4;
  uVar15 = (uint)CARRY4(uVar15,uVar4);
  uVar4 = uVar29 + uVar20;
  uVar30 = uVar4 + uVar15;
  uVar36 = (uint)(uVar13 * 0x402da173);
  uVar31 = uVar30 + uVar36;
  uVar32 = (uint)(uVar7 * 0x50b75fc4);
  uVar25 = uVar32 + uVar31;
  uVar18 = (uint)(uVar3 * 0x45512319);
  uVar23 = uVar18 + uVar25;
  uVar19 = uVar23 + uVar22;
  uVar14 = (ulong)uVar19;
  uVar20 = (uint)CARRY4(uVar18,uVar25) +
           (uint)CARRY4(uVar30,uVar36) +
           (int)(uVar13 * 0x402da173 >> 0x20) +
           (int)(uVar3 * 0x45512319 >> 0x20) + (int)(uVar7 * 0x50b75fc4 >> 0x20) + uVar28 +
           (uint)(CARRY4(uVar29,uVar20) || CARRY4(uVar4,uVar15)) + (uint)CARRY4(uVar32,uVar31) +
           (uint)CARRY4(uVar23,uVar22);
  uVar4 = (uint)(uVar7 * 0x45512319);
  uVar15 = uVar4 + uVar20;
  uVar18 = (uint)(uVar13 * 0x45512319);
  uVar22 = uVar15 + uVar17;
  uVar3 = (ulong)uVar22;
  uVar15 = (int)(uVar7 * 0x45512319 >> 0x20) + uVar18 + (int)(uVar13 * 0x50b75fc4 >> 0x20) +
           (uint)(uVar20 < uVar28) + (uint)CARRY4(uVar4,uVar20) + (uint)CARRY4(uVar15,uVar17);
  uVar29 = uVar15 + uVar9;
  uVar7 = (ulong)uVar29;
  uVar31 = (int)(uVar13 * 0x145512319 >> 0x20) + (uint)(uVar15 < uVar18) +
           (uint)CARRY4(uVar15,uVar9);
  uVar13 = (ulong)uVar31;
  uVar10 = uVar14 * 0x2fc9bebf + CONCAT44(uVar33,uVar6 + *l);
  uVar9 = (uint)(uVar10 >> 0x20);
  uVar15 = (uint)(uVar3 * 0x2fc9bebf);
  uVar18 = uVar15 + uVar9;
  uVar36 = (uint)(uVar14 * 0x402da173);
  uVar9 = (int)(uVar14 * 0x402da173 >> 0x20) + uVar34 + (uint)(uVar9 < uVar33) +
          (int)(uVar3 * 0x2fc9bebf >> 0x20) + (uint)CARRY4(uVar15,uVar9) +
          (uint)CARRY4(uVar36,uVar18);
  uVar20 = (uint)(uVar7 * 0x2fc9bebf);
  uVar4 = uVar20 + uVar9;
  uVar15 = (uint)(uVar3 * 0x402da173);
  uVar32 = uVar15 + uVar4;
  uVar17 = (uint)(uVar14 * 0x50b75fc4);
  uVar9 = (uint)CARRY4(uVar15,uVar4) +
          (int)(uVar3 * 0x402da173 >> 0x20) + (int)(uVar14 * 0x50b75fc4 >> 0x20) + uVar35 +
          (int)(uVar7 * 0x2fc9bebf >> 0x20) + (uint)(uVar9 < uVar34) + (uint)CARRY4(uVar20,uVar9) +
          (uint)CARRY4(uVar17,uVar32);
  uVar28 = (uint)(uVar13 * 0x2fc9bebf);
  uVar23 = uVar28 + uVar9;
  uVar6 = (uint)(uVar7 * 0x402da173);
  uVar20 = uVar6 + uVar23;
  uVar15 = (uint)(uVar3 * 0x50b75fc4);
  uVar4 = uVar15 + uVar20;
  uVar23 = (uint)CARRY4(uVar6,uVar23) +
           (int)(uVar3 * 0x50b75fc4 >> 0x20) + (int)(uVar7 * 0x402da173 >> 0x20) +
           (int)(uVar13 * 0x2fc9bebf >> 0x20) + (uint)(uVar9 < uVar35) + (uint)CARRY4(uVar28,uVar9)
           + (uint)CARRY4(uVar15,uVar20);
  uVar20 = (uint)(uVar14 * 0x45512319);
  uVar9 = (uint)CARRY4(uVar20,uVar4);
  uVar30 = (uint)(uVar14 * 0x45512319 >> 0x20);
  uVar15 = uVar23 + uVar30;
  uVar28 = uVar15 + uVar9;
  uVar25 = uVar28 + uVar21;
  bVar39 = uVar1 <= uVar31;
  uVar6 = 0x2fc9bebf;
  if (bVar39) {
    uVar6 = 0;
  }
  uVar33 = 0x402da173;
  if (bVar39) {
    uVar33 = 0;
  }
  uVar34 = 0x50b75fc4;
  if (bVar39) {
    uVar34 = 0;
  }
  uVar16 = uVar6 + uVar25;
  uVar12 = (uint)(uVar13 * 0x402da173);
  uVar11 = uVar12 + uVar16;
  uVar35 = (uint)(uVar7 * 0x50b75fc4);
  uVar5 = uVar35 + uVar11;
  uVar27 = (uint)(uVar3 * 0x45512319);
  uVar26 = uVar27 + uVar5;
  uVar9 = (uint)CARRY4(uVar27,uVar5) +
          (uint)CARRY4(uVar12,uVar16) +
          (uint)CARRY4(uVar28,uVar21) +
          (int)(uVar13 * 0x402da173 >> 0x20) +
          (int)(uVar7 * 0x50b75fc4 >> 0x20) + (int)(uVar3 * 0x45512319 >> 0x20) + uVar37 +
          (uint)(CARRY4(uVar23,uVar30) || CARRY4(uVar15,uVar9)) + (uint)CARRY4(uVar6,uVar25) +
          (uint)CARRY4(uVar35,uVar11) + (uint)CARRY4(uVar26,uVar19);
  uVar6 = (uint)(uVar13 * 0x50b75fc4);
  uVar28 = uVar6 + uVar33 + uVar9;
  uVar15 = (uint)(uVar7 * 0x45512319);
  uVar23 = uVar15 + uVar28;
  uVar6 = (uint)CARRY4(uVar15,uVar28) +
          uVar38 + (int)(uVar7 * 0x45512319 >> 0x20) + (int)(uVar13 * 0x50b75fc4 >> 0x20) +
          (uint)(uVar9 < uVar37) + (uint)CARRY4(uVar33,uVar9) + (uint)CARRY4(uVar6,uVar33 + uVar9) +
          (uint)CARRY4(uVar23,uVar22);
  uVar9 = (uint)(uVar13 * 0x45512319);
  uVar15 = uVar9 + uVar6 + uVar34;
  uVar6 = (uint)CARRY4(uVar9,uVar6 + uVar34) +
          uVar24 + (int)(uVar13 * 0x45512319 >> 0x20) + (uint)(uVar6 < uVar38) +
          (uint)CARRY4(uVar6,uVar34) + (uint)CARRY4(uVar15,uVar29);
  uVar9 = 0x45512319;
  if (uVar31 >= uVar1) {
    uVar9 = 0;
  }
  lVar8 = (ulong)CARRY4(uVar9,uVar6) + (ulong)(uVar6 < uVar24) + (ulong)(uVar31 < uVar1) +
          (ulong)CARRY4(uVar9 + uVar6,uVar31);
  uVar10 = lVar8 * 0x2fc9bebf + (uVar10 & 0xffffffff);
  r->d[0] = (uint32_t)uVar10;
  uVar10 = lVar8 * 0x402da173 + (ulong)(uVar36 + uVar18) + (uVar10 >> 0x20);
  r->d[1] = (uint32_t)uVar10;
  uVar10 = lVar8 * 0x50b75fc4 + (ulong)(uVar17 + uVar32) + (uVar10 >> 0x20);
  r->d[2] = (uint32_t)uVar10;
  uVar10 = lVar8 * 0x45512319 + (ulong)(uVar20 + uVar4) + (uVar10 >> 0x20);
  r->d[3] = (uint32_t)uVar10;
  uVar10 = (ulong)(uVar26 + uVar19) + lVar8 + (uVar10 >> 0x20);
  r->d[4] = (uint32_t)uVar10;
  uVar10 = (ulong)(uVar23 + uVar22) + (uVar10 >> 0x20);
  r->d[5] = (uint32_t)uVar10;
  uVar10 = (ulong)(uVar15 + uVar29) + (uVar10 >> 0x20);
  r->d[6] = (uint32_t)uVar10;
  lVar8 = (ulong)(uVar9 + uVar6 + uVar31) + (uVar10 >> 0x20);
  r->d[7] = (uint32_t)lVar8;
  iVar2 = secp256k1_scalar_check_overflow(r);
  secp256k1_scalar_reduce(r,(int)((ulong)lVar8 >> 0x20) + iVar2);
  return;
}

Assistant:

static void secp256k1_scalar_reduce_512(secp256k1_scalar *r, const uint32_t *l) {
    uint64_t c;
    uint32_t n0 = l[8], n1 = l[9], n2 = l[10], n3 = l[11], n4 = l[12], n5 = l[13], n6 = l[14], n7 = l[15];
    uint32_t m0, m1, m2, m3, m4, m5, m6, m7, m8, m9, m10, m11, m12;
    uint32_t p0, p1, p2, p3, p4, p5, p6, p7, p8;

    /* 96 bit accumulator. */
    uint32_t c0, c1, c2;

    /* Reduce 512 bits into 385. */
    /* m[0..12] = l[0..7] + n[0..7] * SECP256K1_N_C. */
    c0 = l[0]; c1 = 0; c2 = 0;
    muladd_fast(n0, SECP256K1_N_C_0);
    extract_fast(m0);
    sumadd_fast(l[1]);
    muladd(n1, SECP256K1_N_C_0);
    muladd(n0, SECP256K1_N_C_1);
    extract(m1);
    sumadd(l[2]);
    muladd(n2, SECP256K1_N_C_0);
    muladd(n1, SECP256K1_N_C_1);
    muladd(n0, SECP256K1_N_C_2);
    extract(m2);
    sumadd(l[3]);
    muladd(n3, SECP256K1_N_C_0);
    muladd(n2, SECP256K1_N_C_1);
    muladd(n1, SECP256K1_N_C_2);
    muladd(n0, SECP256K1_N_C_3);
    extract(m3);
    sumadd(l[4]);
    muladd(n4, SECP256K1_N_C_0);
    muladd(n3, SECP256K1_N_C_1);
    muladd(n2, SECP256K1_N_C_2);
    muladd(n1, SECP256K1_N_C_3);
    sumadd(n0);
    extract(m4);
    sumadd(l[5]);
    muladd(n5, SECP256K1_N_C_0);
    muladd(n4, SECP256K1_N_C_1);
    muladd(n3, SECP256K1_N_C_2);
    muladd(n2, SECP256K1_N_C_3);
    sumadd(n1);
    extract(m5);
    sumadd(l[6]);
    muladd(n6, SECP256K1_N_C_0);
    muladd(n5, SECP256K1_N_C_1);
    muladd(n4, SECP256K1_N_C_2);
    muladd(n3, SECP256K1_N_C_3);
    sumadd(n2);
    extract(m6);
    sumadd(l[7]);
    muladd(n7, SECP256K1_N_C_0);
    muladd(n6, SECP256K1_N_C_1);
    muladd(n5, SECP256K1_N_C_2);
    muladd(n4, SECP256K1_N_C_3);
    sumadd(n3);
    extract(m7);
    muladd(n7, SECP256K1_N_C_1);
    muladd(n6, SECP256K1_N_C_2);
    muladd(n5, SECP256K1_N_C_3);
    sumadd(n4);
    extract(m8);
    muladd(n7, SECP256K1_N_C_2);
    muladd(n6, SECP256K1_N_C_3);
    sumadd(n5);
    extract(m9);
    muladd(n7, SECP256K1_N_C_3);
    sumadd(n6);
    extract(m10);
    sumadd_fast(n7);
    extract_fast(m11);
    VERIFY_CHECK(c0 <= 1);
    m12 = c0;

    /* Reduce 385 bits into 258. */
    /* p[0..8] = m[0..7] + m[8..12] * SECP256K1_N_C. */
    c0 = m0; c1 = 0; c2 = 0;
    muladd_fast(m8, SECP256K1_N_C_0);
    extract_fast(p0);
    sumadd_fast(m1);
    muladd(m9, SECP256K1_N_C_0);
    muladd(m8, SECP256K1_N_C_1);
    extract(p1);
    sumadd(m2);
    muladd(m10, SECP256K1_N_C_0);
    muladd(m9, SECP256K1_N_C_1);
    muladd(m8, SECP256K1_N_C_2);
    extract(p2);
    sumadd(m3);
    muladd(m11, SECP256K1_N_C_0);
    muladd(m10, SECP256K1_N_C_1);
    muladd(m9, SECP256K1_N_C_2);
    muladd(m8, SECP256K1_N_C_3);
    extract(p3);
    sumadd(m4);
    muladd(m12, SECP256K1_N_C_0);
    muladd(m11, SECP256K1_N_C_1);
    muladd(m10, SECP256K1_N_C_2);
    muladd(m9, SECP256K1_N_C_3);
    sumadd(m8);
    extract(p4);
    sumadd(m5);
    muladd(m12, SECP256K1_N_C_1);
    muladd(m11, SECP256K1_N_C_2);
    muladd(m10, SECP256K1_N_C_3);
    sumadd(m9);
    extract(p5);
    sumadd(m6);
    muladd(m12, SECP256K1_N_C_2);
    muladd(m11, SECP256K1_N_C_3);
    sumadd(m10);
    extract(p6);
    sumadd_fast(m7);
    muladd_fast(m12, SECP256K1_N_C_3);
    sumadd_fast(m11);
    extract_fast(p7);
    p8 = c0 + m12;
    VERIFY_CHECK(p8 <= 2);

    /* Reduce 258 bits into 256. */
    /* r[0..7] = p[0..7] + p[8] * SECP256K1_N_C. */
    c = p0 + (uint64_t)SECP256K1_N_C_0 * p8;
    r->d[0] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p1 + (uint64_t)SECP256K1_N_C_1 * p8;
    r->d[1] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p2 + (uint64_t)SECP256K1_N_C_2 * p8;
    r->d[2] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p3 + (uint64_t)SECP256K1_N_C_3 * p8;
    r->d[3] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p4 + (uint64_t)p8;
    r->d[4] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p5;
    r->d[5] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p6;
    r->d[6] = c & 0xFFFFFFFFUL; c >>= 32;
    c += p7;
    r->d[7] = c & 0xFFFFFFFFUL; c >>= 32;

    /* Final reduction of r. */
    secp256k1_scalar_reduce(r, c + secp256k1_scalar_check_overflow(r));
}